

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

Float pbrt::IntegrateCatmullRom(span<const_float> nodes,span<const_float> f,span<float> cdf)

{
  float fVar1;
  char (*args_2) [13];
  char (*pacVar2) [13];
  float *pfVar3;
  ulong uVar4;
  size_t sVar5;
  float *in_RDX;
  float *in_R8;
  char (*in_R9) [9];
  Float d1;
  Float d0;
  Float width;
  Float f1;
  Float f0;
  Float x1;
  Float x0;
  int i;
  Float sum;
  size_t vb;
  size_t va;
  float local_9c;
  float local_7c;
  char (*in_stack_ffffffffffffff88) [9];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  float fVar6;
  float fVar7;
  float fVar8;
  int in_stack_ffffffffffffffa4;
  float fVar9;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar10;
  undefined4 in_stack_ffffffffffffffac;
  float fVar11;
  int local_50;
  LogLevel in_stack_ffffffffffffffb4;
  float fVar12;
  span<const_float> local_18;
  
  args_2 = (char (*) [13])pstd::span<const_float>::size(&local_18);
  pacVar2 = (char (*) [13])
            pstd::span<const_float>::size((span<const_float> *)&stack0xffffffffffffffd8);
  if (args_2 != pacVar2) {
    LogFatal<char_const(&)[13],char_const(&)[9],char_const(&)[13],unsigned_long&,char_const(&)[9],unsigned_long&>
              (in_stack_ffffffffffffffb4,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (char (*) [13])CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,args_2,(unsigned_long *)in_R8,in_R9,(unsigned_long *)in_RDX
              );
  }
  fVar12 = 0.0;
  pfVar3 = pstd::span<float>::operator[]((span<float> *)&stack0xffffffffffffffc8,0);
  *pfVar3 = 0.0;
  local_50 = 0;
  while( true ) {
    uVar4 = (ulong)local_50;
    sVar5 = pstd::span<const_float>::size(&local_18);
    if (sVar5 - 1 <= uVar4) break;
    pfVar3 = pstd::span<const_float>::operator[](&local_18,(long)local_50);
    fVar11 = *pfVar3;
    pfVar3 = pstd::span<const_float>::operator[](&local_18,(long)(local_50 + 1));
    fVar10 = *pfVar3;
    pfVar3 = pstd::span<const_float>::operator[]
                       ((span<const_float> *)&stack0xffffffffffffffd8,(long)local_50);
    fVar9 = *pfVar3;
    pfVar3 = pstd::span<const_float>::operator[]
                       ((span<const_float> *)&stack0xffffffffffffffd8,(long)(local_50 + 1));
    fVar1 = *pfVar3;
    fVar7 = fVar10 - fVar11;
    if (local_50 < 1) {
      local_7c = fVar1 - fVar9;
    }
    else {
      fVar6 = fVar7;
      pfVar3 = pstd::span<const_float>::operator[]
                         ((span<const_float> *)&stack0xffffffffffffffd8,(long)(local_50 + -1));
      fVar8 = *pfVar3;
      pfVar3 = pstd::span<const_float>::operator[](&local_18,(long)(local_50 + -1));
      local_7c = (fVar7 * (fVar1 - fVar8)) / (fVar10 - *pfVar3);
      fVar7 = fVar6;
    }
    sVar5 = pstd::span<const_float>::size(&local_18);
    if ((ulong)(long)(local_50 + 2) < sVar5) {
      fVar8 = fVar7;
      pfVar3 = pstd::span<const_float>::operator[]
                         ((span<const_float> *)&stack0xffffffffffffffd8,(long)(local_50 + 2));
      fVar10 = *pfVar3 - fVar9;
      pfVar3 = pstd::span<const_float>::operator[](&local_18,(long)(local_50 + 2));
      local_9c = (fVar7 * fVar10) / (*pfVar3 - fVar11);
      fVar7 = fVar8;
    }
    else {
      local_9c = fVar1 - fVar9;
    }
    fVar11 = fVar7 * ((fVar9 + fVar1) / 2.0 + (local_7c - local_9c) / 12.0) + fVar12;
    fVar12 = fVar11;
    pfVar3 = pstd::span<float>::operator[]
                       ((span<float> *)&stack0xffffffffffffffc8,(long)(local_50 + 1));
    *pfVar3 = fVar11;
    local_50 = local_50 + 1;
  }
  return fVar12;
}

Assistant:

PBRT_CPU_GPU Float IntegrateCatmullRom(pstd::span<const Float> nodes, pstd::span<const Float> f,
                          pstd::span<Float> cdf) {
    CHECK_EQ(nodes.size(), f.size());
    Float sum = 0;
    cdf[0] = 0;
    for (int i = 0; i < nodes.size() - 1; ++i) {
        // Look up $x_i$ and function values of spline segment _i_
        Float x0 = nodes[i], x1 = nodes[i + 1];
        Float f0 = f[i], f1 = f[i + 1];
        Float width = x1 - x0;

        // Approximate derivatives using finite differences
        Float d0 = (i > 0) ? width * (f1 - f[i - 1]) / (x1 - nodes[i - 1]) : (f1 - f0);
        Float d1 = (i + 2 < nodes.size()) ? width * (f[i + 2] - f0) / (nodes[i + 2] - x0)
                                          : (f1 - f0);

        // Keep a running sum and build a cumulative distribution function
        sum += width * ((f0 + f1) / 2 + (d0 - d1) / 12);
        cdf[i + 1] = sum;
    }
    return sum;
}